

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O2

void __thiscall
addrman_tests::caddrinfo_get_tried_bucket_legacy::test_method
          (caddrinfo_get_tried_bucket_legacy *this)

{
  long lVar1;
  CService ipIn;
  CService ipIn_00;
  CService ipIn_01;
  CService ipIn_02;
  bool bVar2;
  int iVar3;
  int iVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  AddrInfo *pAVar6;
  iterator pvVar7;
  int *piVar8;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  undefined4 in_stack_fffffffffffffa48;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffa4c;
  undefined4 uVar10;
  undefined8 in_stack_fffffffffffffa50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  undefined8 in_stack_fffffffffffffa58;
  char *pcVar12;
  undefined8 in_stack_fffffffffffffa60;
  undefined8 in_stack_fffffffffffffa68;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  int local_564;
  char *local_560;
  char *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  string local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  CService local_430;
  string local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  string local_3c8;
  string local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  CService local_368;
  int bucket;
  undefined4 uStack_33c;
  undefined8 local_338;
  shared_count asStack_330 [5];
  AddrInfo infoi;
  set<int,_std::less<int>,_std::allocator<int>_> buckets;
  AddrInfo info2;
  uint256 nKey2;
  uint256 nKey1;
  AddrInfo info1;
  CNetAddr source1;
  CService local_f8;
  CAddress addr2;
  CService local_98;
  CAddress addr1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&info1,"250.1.1.1",(allocator<char> *)&info2);
  ResolveService(&local_98,(string *)&info1,0x208d);
  ipIn.super_CNetAddr.m_addr._union._4_4_ = in_stack_fffffffffffffa4c;
  ipIn.super_CNetAddr.m_addr._union._0_4_ = in_stack_fffffffffffffa48;
  ipIn.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffffa50;
  ipIn.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffffa58;
  ipIn.super_CNetAddr.m_net = (int)in_stack_fffffffffffffa60;
  ipIn.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffa60 >> 0x20);
  ipIn._32_8_ = in_stack_fffffffffffffa68;
  CAddress::CAddress(&addr1,ipIn,(ServiceFlags)&local_98);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_98);
  std::__cxx11::string::~string((string *)&info1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&info1,"250.1.1.1",(allocator<char> *)&info2);
  ResolveService(&local_f8,(string *)&info1,9999);
  ipIn_00.super_CNetAddr.m_addr._union._4_4_ = in_stack_fffffffffffffa4c;
  ipIn_00.super_CNetAddr.m_addr._union._0_4_ = in_stack_fffffffffffffa48;
  ipIn_00.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffffa50;
  ipIn_00.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffffa58;
  ipIn_00.super_CNetAddr.m_net = (int)in_stack_fffffffffffffa60;
  ipIn_00.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffa60 >> 0x20);
  ipIn_00._32_8_ = in_stack_fffffffffffffa68;
  CAddress::CAddress(&addr2,ipIn_00,(ServiceFlags)&local_f8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8);
  std::__cxx11::string::~string((string *)&info1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&info1,"250.1.1.1",(allocator<char> *)&info2);
  ResolveIP(&source1,(string *)&info1);
  std::__cxx11::string::~string((string *)&info1);
  AddrInfo::AddrInfo(&info1,&addr1,&source1);
  info2.source.m_addr._union._8_8_ = 0;
  info2.source.m_addr._size = 0;
  info2.source.m_addr._20_4_ = 0;
  info2.m_last_count_attempt.__d.__r = (duration)0;
  info2.source.m_addr._union.indirect_contents.indirect = (char *)0x0;
  info2.super_CAddress.nServices = NODE_NONE;
  info2.m_last_try.__d.__r = (duration)0;
  info2.super_CAddress.super_CService.port = 0;
  info2.super_CAddress.super_CService._34_6_ = 0;
  info2.super_CAddress.nTime.__d.__r = (duration)0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._size = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_net = NET_UNROUTABLE;
  info2.super_CAddress.super_CService.super_CNetAddr.m_scope_id = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)0x0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  info2.source.m_net = NET_UNROUTABLE;
  info2.source.m_scope_id = 0;
  CSHA256::CSHA256((CSHA256 *)&info2);
  ser_writedata32<HashWriter>((HashWriter *)&info2,1);
  HashWriter::GetHash(&nKey1,(HashWriter *)&info2);
  info2.source.m_addr._union._8_8_ = 0;
  info2.source.m_addr._size = 0;
  info2.source.m_addr._20_4_ = 0;
  info2.m_last_count_attempt.__d.__r = (duration)0;
  info2.source.m_addr._union.indirect_contents.indirect = (char *)0x0;
  info2.super_CAddress.nServices = NODE_NONE;
  info2.m_last_try.__d.__r = (duration)0;
  info2.super_CAddress.super_CService.port = 0;
  info2.super_CAddress.super_CService._34_6_ = 0;
  info2.super_CAddress.nTime.__d.__r = (duration)0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._size = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_net = NET_UNROUTABLE;
  info2.super_CAddress.super_CService.super_CNetAddr.m_scope_id = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)0x0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  info2.source.m_net = NET_UNROUTABLE;
  info2.source.m_scope_id = 0;
  CSHA256::CSHA256((CSHA256 *)&info2);
  ser_writedata32<HashWriter>((HashWriter *)&info2,2);
  HashWriter::GetHash(&nKey2,(HashWriter *)&info2);
  local_480 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x1d6;
  file.m_begin = (iterator)&local_480;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_490,msg);
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "<W\x1b";
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  info2.super_CAddress.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_498 = "";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._0_4_ =
       AddrInfo::GetTriedBucket(&info1,&nKey1,&EMPTY_NETGROUPMAN);
  pAVar6 = &infoi;
  bucket = 0x28;
  pcVar12 = "40";
  pvVar5 = (iterator)0x2;
  piVar8 = &bucket;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&info2,&local_4a0,0x1d6,1,2,pAVar6,0xb4fa0e);
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)pAVar6;
  msg_00.m_begin = pvVar5;
  file_00.m_end = (iterator)0x1da;
  file_00.m_begin = (iterator)&local_4b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_4c0,
             msg_00);
  iVar3 = AddrInfo::GetTriedBucket(&info1,&nKey1,&EMPTY_NETGROUPMAN);
  iVar4 = AddrInfo::GetTriedBucket(&info1,&nKey2,&EMPTY_NETGROUPMAN);
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.direct[0] = iVar3 != iVar4;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._size = 0;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  _bucket = 
  "info1.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN) != info1.GetTriedBucket(nKey2, EMPTY_NETGROUPMAN)"
  ;
  local_338 = (long)
              "info1.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN) != info1.GetTriedBucket(nKey2, EMPTY_NETGROUPMAN)"
              + 0x60;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "<W\x1b";
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_4d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4c8 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  info2.super_CAddress.super_CService.super_CNetAddr._24_8_ = &bucket;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&infoi,(lazy_ostream *)&info2,1,0,WARN,(check_type)piVar8,
             (size_t)&local_4d0,0x1da);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._size);
  AddrInfo::AddrInfo(&info2,&addr2,&source1);
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4d8 = "";
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar5;
  file_01.m_end = (iterator)0x1e0;
  file_01.m_begin = (iterator)&local_4e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_4f0,
             msg_01);
  CService::GetKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&buckets,
                   (CService *)&info1);
  CService::GetKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_388,
                   (CService *)&info2);
  bVar2 = std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&buckets,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_388);
  local_338 = (element_type *)0x0;
  asStack_330[0].pi_ = (sp_counted_base *)0x0;
  infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = &local_3a8;
  local_3a8._M_dataplus._M_p = "info1.GetKey() != info2.GetKey()";
  local_3a8._M_string_length = 0xb4fabe;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "<W\x1b";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_500 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4f8 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  bucket._0_1_ = (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&bucket,(lazy_ostream *)&infoi,1,0,WARN,(check_type)piVar8,
             (size_t)&local_500,0x1e0);
  boost::detail::shared_count::~shared_count(asStack_330);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_388);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&buckets);
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_508 = "";
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar5;
  file_02.m_end = (iterator)0x1e1;
  file_02.m_begin = (iterator)&local_510;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_520,
             msg_02);
  iVar3 = AddrInfo::GetTriedBucket(&info1,&nKey1,&EMPTY_NETGROUPMAN);
  iVar4 = AddrInfo::GetTriedBucket(&info2,&nKey1,&EMPTY_NETGROUPMAN);
  bucket._0_1_ = (readonly_property<bool>)(readonly_property<bool>)(iVar3 != iVar4);
  local_338 = (element_type *)0x0;
  asStack_330[0].pi_ = (sp_counted_base *)0x0;
  buckets._M_t._M_impl._0_8_ = anon_var_dwarf_127ad3;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (long)
       "info1.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN) != info2.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN)"
       + 0x60;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "<W\x1b";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_530 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_528 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = &buckets;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&bucket,(lazy_ostream *)&infoi,1,0,WARN,(check_type)piVar8,
             (size_t)&local_530,0x1e1);
  boost::detail::shared_count::~shared_count(asStack_330);
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &buckets._M_t._M_impl.super__Rb_tree_header._M_header;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  buckets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (local_450._M_dataplus._M_p._0_4_ = 0; (int)local_450._M_dataplus._M_p < 0xff;
      local_450._M_dataplus._M_p._0_4_ = (int)local_450._M_dataplus._M_p + 1) {
    util::ToString<int>(&local_3a8,(int *)&local_450);
    std::operator+(&local_388,"250.1.1.",&local_3a8);
    ResolveService(&local_368,&local_388,0);
    ipIn_01.super_CNetAddr.m_addr._union._4_4_ = uVar10;
    ipIn_01.super_CNetAddr.m_addr._union._0_4_ = uVar9;
    ipIn_01.super_CNetAddr.m_addr._union._8_8_ = piVar8;
    ipIn_01.super_CNetAddr.m_addr._16_8_ = pcVar12;
    ipIn_01.super_CNetAddr.m_net = (int)in_stack_fffffffffffffa60;
    ipIn_01.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffa60 >> 0x20);
    ipIn_01._32_8_ = in_stack_fffffffffffffa68;
    CAddress::CAddress((CAddress *)&bucket,ipIn_01,(ServiceFlags)&local_368);
    util::ToString<int>(&local_408,(int *)&local_450);
    std::operator+(&local_3e8,"250.1.1.",&local_408);
    ResolveIP((CNetAddr *)&local_3c8,&local_3e8);
    AddrInfo::AddrInfo(&infoi,(CAddress *)&bucket,(CNetAddr *)&local_3c8);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_408);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&bucket);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_368);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_3a8);
    iVar3 = AddrInfo::GetTriedBucket(&infoi,&nKey1,&EMPTY_NETGROUPMAN);
    bucket = iVar3;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&buckets,
               &bucket);
    AddrInfo::~AddrInfo(&infoi);
  }
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_538 = "";
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar5;
  file_03.m_end = (iterator)0x1ed;
  file_03.m_begin = (iterator)&local_540;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_550,
             msg_03);
  pbVar11 = &local_388;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "<W\x1b";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_560 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_558 = "";
  piVar8 = &bucket;
  _bucket = (char *)buckets._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_388._M_dataplus._M_p._0_4_ = 8;
  pcVar12 = "8U";
  uVar9 = 0xcb7705;
  uVar10 = 0;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&infoi,&local_560,0x1ed,1);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&buckets._M_t);
  for (local_564 = 0; local_564 < 0xff; local_564 = local_564 + 1) {
    util::ToString<int>(&local_3c8,&local_564);
    std::operator+(&local_3a8,"250.",&local_3c8);
    std::operator+(&local_388,&local_3a8,".1.1");
    ResolveService(&local_430,&local_388,0);
    ipIn_02.super_CNetAddr.m_addr._union._4_4_ = uVar10;
    ipIn_02.super_CNetAddr.m_addr._union._0_4_ = uVar9;
    ipIn_02.super_CNetAddr.m_addr._union._8_8_ = pbVar11;
    ipIn_02.super_CNetAddr.m_addr._16_8_ = pcVar12;
    ipIn_02.super_CNetAddr.m_net = (int)in_stack_fffffffffffffa60;
    ipIn_02.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffa60 >> 0x20);
    ipIn_02._32_8_ = in_stack_fffffffffffffa68;
    CAddress::CAddress((CAddress *)&bucket,ipIn_02,(ServiceFlags)&local_430);
    util::ToString<int>(&local_470,&local_564);
    std::operator+(&local_450,"250.",&local_470);
    std::operator+(&local_408,&local_450,".1.1");
    ResolveIP((CNetAddr *)&local_3e8,&local_408);
    AddrInfo::AddrInfo(&infoi,(CAddress *)&bucket,(CNetAddr *)&local_3e8);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&local_470);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&bucket);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_430);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    iVar3 = AddrInfo::GetTriedBucket(&infoi,&nKey1,&EMPTY_NETGROUPMAN);
    bucket = iVar3;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&buckets,
               &bucket);
    AddrInfo::~AddrInfo(&infoi);
  }
  local_578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)piVar8;
  msg_04.m_begin = pvVar5;
  file_04.m_end = (iterator)0x1f9;
  file_04.m_begin = (iterator)&local_578;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_588,
             msg_04);
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "<W\x1b";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  _bucket = (char *)buckets._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_388._M_dataplus._M_p._0_4_ = 0xa0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&infoi,&stack0xfffffffffffffa68,0x1f9,1,2,&bucket,0xcb7705,&local_388,"160U");
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&buckets._M_t);
  AddrInfo::~AddrInfo(&info2);
  AddrInfo::~AddrInfo(&info1);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&source1.m_addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(caddrinfo_get_tried_bucket_legacy)
{
    CAddress addr1 = CAddress(ResolveService("250.1.1.1", 8333), NODE_NONE);
    CAddress addr2 = CAddress(ResolveService("250.1.1.1", 9999), NODE_NONE);

    CNetAddr source1 = ResolveIP("250.1.1.1");


    AddrInfo info1 = AddrInfo(addr1, source1);

    uint256 nKey1 = (HashWriter{} << 1).GetHash();
    uint256 nKey2 = (HashWriter{} << 2).GetHash();

    BOOST_CHECK_EQUAL(info1.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN), 40);

    // Test: Make sure key actually randomizes bucket placement. A fail on
    //  this test could be a security issue.
    BOOST_CHECK(info1.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN) != info1.GetTriedBucket(nKey2, EMPTY_NETGROUPMAN));

    // Test: Two addresses with same IP but different ports can map to
    //  different buckets because they have different keys.
    AddrInfo info2 = AddrInfo(addr2, source1);

    BOOST_CHECK(info1.GetKey() != info2.GetKey());
    BOOST_CHECK(info1.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN) != info2.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN));

    std::set<int> buckets;
    for (int i = 0; i < 255; i++) {
        AddrInfo infoi = AddrInfo(
            CAddress(ResolveService("250.1.1." + ToString(i)), NODE_NONE),
            ResolveIP("250.1.1." + ToString(i)));
        int bucket = infoi.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the same /16 prefix should
    // never get more than 8 buckets with legacy grouping
    BOOST_CHECK_EQUAL(buckets.size(), 8U);

    buckets.clear();
    for (int j = 0; j < 255; j++) {
        AddrInfo infoj = AddrInfo(
            CAddress(ResolveService("250." + ToString(j) + ".1.1"), NODE_NONE),
            ResolveIP("250." + ToString(j) + ".1.1"));
        int bucket = infoj.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the different /16 prefix should map to more than
    // 8 buckets with legacy grouping
    BOOST_CHECK_EQUAL(buckets.size(), 160U);
}